

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmsio.c
# Opt level: O2

int FmsIOReadFmsMetaData(FmsIOContext *ctx,FmsIOFunctions *io,char *key,FmsIOMetaDataInfo *mdinfo)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  FmsIOMetaDataInfo *mdinfo_00;
  char *key_00;
  ulong uVar4;
  uint uVar5;
  char *str;
  
  if (mdinfo == (FmsIOMetaDataInfo *)0x0) {
    return 1;
  }
  pcVar3 = join_keys(key,"MetaDataType");
  str = (char *)0x0;
  iVar1 = (*io->get_string)(ctx,pcVar3,&str);
  free(pcVar3);
  if (iVar1 != 0) {
    return 2;
  }
  iVar1 = FmsGetMetaDataTypeFromName(str,&mdinfo->mdtype);
  if (iVar1 != 0) {
    return 3;
  }
  pcVar3 = join_keys(key,"Name");
  iVar1 = (*io->get_string)(ctx,pcVar3,&mdinfo->name);
  free(pcVar3);
  if (iVar1 == 0) {
    switch(mdinfo->mdtype) {
    case FMS_INTEGER:
      pcVar3 = join_keys(key,"Data");
      iVar1 = (*io->get_typed_int_array)
                        (ctx,pcVar3,&(mdinfo->subtype).i_type,&mdinfo->data,&mdinfo->size);
      free(pcVar3);
      if (iVar1 != 0) {
        return 5;
      }
      break;
    case FMS_SCALAR:
      pcVar3 = join_keys(key,"Data");
      iVar1 = (*io->get_scalar_array)
                        (ctx,pcVar3,&(mdinfo->subtype).s_type,&mdinfo->data,&mdinfo->size);
      free(pcVar3);
      if (iVar1 != 0) {
        return 6;
      }
      break;
    case FMS_STRING:
      pcVar3 = join_keys(key,"Data");
      str = (char *)0x0;
      iVar1 = (*io->get_string)(ctx,pcVar3,&str);
      free(pcVar3);
      if (iVar1 != 0) {
        return 7;
      }
      if (str == (char *)0x0) {
        pcVar3 = (char *)0x0;
      }
      else {
        pcVar3 = strdup(str);
        if (pcVar3 == (char *)0x0) {
          return 7;
        }
      }
      mdinfo->data = pcVar3;
      break;
    case FMS_META_DATA:
      pcVar3 = join_keys(key,"Size");
      iVar1 = (*io->get_int)(ctx,pcVar3,&mdinfo->size);
      free(pcVar3);
      if (iVar1 != 0) {
        return 8;
      }
      mdinfo_00 = (FmsIOMetaDataInfo *)calloc(mdinfo->size,0x20);
      mdinfo->data = mdinfo_00;
      pcVar3 = join_keys(key,"Data");
      uVar5 = 0;
      for (uVar4 = 0; uVar4 < mdinfo->size; uVar4 = uVar4 + 1) {
        sprintf((char *)&str,"%lu",uVar4);
        key_00 = join_keys(pcVar3,(char *)&str);
        uVar2 = FmsIOReadFmsMetaData(ctx,io,key_00,mdinfo_00);
        uVar5 = uVar5 | uVar2;
        mdinfo_00 = mdinfo_00 + 1;
      }
      free(pcVar3);
      if (uVar5 != 0) {
        return 9;
      }
    }
    return 0;
  }
  return 4;
}

Assistant:

static int
FmsIOReadFmsMetaData(FmsIOContext *ctx, FmsIOFunctions *io, const char *key,
                     FmsIOMetaDataInfo *mdinfo) {
  int err = 0;
  if(!mdinfo) E_RETURN(1);

  {
    char *kmdtype = join_keys(key, "MetaDataType");
    const char *str = NULL;
    err = (*io->get_string)(ctx, kmdtype, &str);
    FREE(kmdtype);
    if(err)
      E_RETURN(2);
    if(FmsGetMetaDataTypeFromName(str, &mdinfo->mdtype))
      E_RETURN(3);
  }

  // Get name
  {
    char *kname = join_keys(key, "Name");
    err = (*io->get_string)(ctx, kname, &mdinfo->name);
    FREE(kname);
    if(err)
      E_RETURN(4);
  }

  switch (mdinfo->mdtype) {
  case FMS_INTEGER: {
    // Get DataArray
    char *kdata = join_keys(key, "Data");
    err = (*io->get_typed_int_array)(ctx, kdata, &mdinfo->subtype.i_type,
                                     &mdinfo->data, &mdinfo->size);
    FREE(kdata);
    if(err)
      E_RETURN(5);
    break;
  }
  case FMS_SCALAR: {
    // Get data array
    char *kdata = join_keys(key, "Data");
    err = (*io->get_scalar_array)(ctx, kdata, &mdinfo->subtype.s_type,
                                  &mdinfo->data, &mdinfo->size);
    FREE(kdata);
    if(err)
      E_RETURN(6);
    break;
  }
  case FMS_STRING: {
    // Get data array
    char *kdata = join_keys(key, "Data");
    const char *md_str = NULL;
    err = (*io->get_string)(ctx, kdata, &md_str);
    FREE(kdata);
    /* Copy the string we got from the get_string. Its lifetime has to be tied to the metadata. */
    if(err || FmsIOCopyString(md_str, (char **)&mdinfo->data))
      E_RETURN(7);
    break;
  }
  case FMS_META_DATA: {
    // Get size
    FmsInt i;
    FmsIOMetaDataInfo *mds = NULL;
    char *ksize = join_keys(key, "Size"), *kdata = NULL;
    err = (*io->get_int)(ctx, ksize, &mdinfo->size);
    FREE(ksize);
    if(err)
      E_RETURN(8);
    mdinfo->data = calloc(mdinfo->size, sizeof(FmsIOMetaDataInfo));
    mds = (FmsIOMetaDataInfo *)mdinfo->data;
    kdata = join_keys(key, "Data");
    for(i = 0; i < mdinfo->size; i++) {
      char temp[21], *ki = NULL;
      sprintf(temp, FMS_LU, i);
      ki = join_keys(kdata, temp);
      err |= FmsIOReadFmsMetaData(ctx, io, ki, &mds[i]);
    }
    FREE(kdata);
    if(err)
      E_RETURN(9);
    break;
  }
  default:
    break;
  }
  return 0;
}